

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O1

int __thiscall TDiabloRoot::ParseDirectory_Phase2(TDiabloRoot *this)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  DIABLO3_DIRECTORY *Directory;
  PATH_BUFFER PathBuffer;
  char szPathBuffer [1024];
  PATH_BUFFER local_450;
  char local_438 [1023];
  char local_39 [9];
  
  Directory = this->RootFolders;
  lVar3 = 0x20;
  do {
    if (Directory->pbDirectoryData != (LPBYTE)0x0) {
      local_450.szEnd = local_39;
      local_438[0] = '\0';
      local_450.szBegin = local_438;
      local_450.szPtr = local_438;
      if ((ulong)Directory->dwNodeIndex != 0) {
        CASC_FILE_TREE::PathAt
                  (&(this->super_TFileTreeRoot).FileTree,local_438,0x400,
                   (ulong)Directory->dwNodeIndex);
        pcVar1 = local_450.szBegin;
        sVar2 = strlen(local_438);
        local_450.szPtr = pcVar1 + sVar2;
      }
      ParseAssetEntries(this,Directory,&local_450);
      ParseAssetAndIdxEntries(this,Directory,&local_450);
    }
    Directory = Directory + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int ParseDirectory_Phase2()
    {
        PATH_BUFFER PathBuffer;
        char szPathBuffer[MAX_PATH];

        // Parse each root subdirectory
        for(size_t i = 0; i < DIABLO3_MAX_ROOT_FOLDERS; i++)
        {
            // Is this root folder loaded?
            if(RootFolders[i].pbDirectoryData != NULL)
            {
                PathBuffer.szBegin = szPathBuffer;
                PathBuffer.szPtr = szPathBuffer;
                PathBuffer.szEnd = szPathBuffer + MAX_PATH - 1;
                szPathBuffer[0] = 0;

                // Retrieve the parent name
                if(RootFolders[i].dwNodeIndex != 0)
                {
                    FileTree.PathAt(szPathBuffer, MAX_PATH, RootFolders[i].dwNodeIndex);
                    PathBuffer.szPtr = PathBuffer.szBegin + strlen(szPathBuffer);
                }

//              FILE * fp = fopen("E:\\FileIndex.txt", "wt");

                // Array of DIABLO3_ASSET_ENTRY entries.
                // These are for files belonging to an asset, without subitem number.
                // Example: "SoundBank\SoundFile.smp"
                ParseAssetEntries(RootFolders[i], PathBuffer);

                // Array of DIABLO3_ASSETIDX_ENTRY entries.
                // These are for files belonging to an asset, with a subitem number.
                // Example: "SoundBank\SoundFile\0001.smp"
                ParseAssetAndIdxEntries(RootFolders[i], PathBuffer);

//              fclose(fp);
            }
        }

        return ERROR_SUCCESS;
    }